

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.h
# Opt level: O0

void __thiscall aiNodeAnim::aiNodeAnim(aiNodeAnim *this)

{
  aiNodeAnim *this_local;
  
  aiString::aiString(&this->mNodeName);
  this->mNumPositionKeys = 0;
  this->mPositionKeys = (aiVectorKey *)0x0;
  this->mNumRotationKeys = 0;
  this->mRotationKeys = (aiQuatKey *)0x0;
  this->mNumScalingKeys = 0;
  this->mScalingKeys = (aiVectorKey *)0x0;
  this->mPreState = aiAnimBehaviour_DEFAULT;
  this->mPostState = aiAnimBehaviour_DEFAULT;
  return;
}

Assistant:

aiNodeAnim() AI_NO_EXCEPT
    : mNumPositionKeys( 0 )
    , mPositionKeys( nullptr )
    , mNumRotationKeys( 0 )
    , mRotationKeys( nullptr )
    , mNumScalingKeys( 0 )
    , mScalingKeys( nullptr )
    , mPreState( aiAnimBehaviour_DEFAULT )
    , mPostState( aiAnimBehaviour_DEFAULT ) {
         // empty
    }